

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O0

expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
tinyusdz::tydra::(anonymous_namespace)::VertexToFaceVarying_abi_cxx11_
          (expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *src,size_t stride_bytes,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexCounts,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices)

{
  size_t sVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  ulong uVar5;
  uchar *__dest;
  uchar *puVar6;
  iterator __first;
  iterator __last;
  _Hash_node<std::pair<const_float,_tinyusdz::tydra::InbetweenShapeTarget>,_false> *value;
  _Hash_node<std::pair<const_float,_tinyusdz::tydra::InbetweenShapeTarget>,_false> *value_00;
  _Hash_node<std::pair<const_float,_tinyusdz::tydra::InbetweenShapeTarget>,_false> *value_01;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_200;
  const_iterator local_1f8;
  allocator local_1e9;
  string local_1e8 [32];
  string local_1c8;
  undefined1 local_1a8 [40];
  size_t v_idx;
  string local_178 [32];
  string local_158;
  undefined1 local_138 [40];
  size_t fv_idx;
  size_t k;
  size_t cnt;
  size_t i;
  size_t faceVertexIndexOffset;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  size_t num_vertices;
  allocator local_c1;
  string local_c0 [32];
  string local_a0;
  undefined1 local_80 [48];
  unexpected_type<const_char_*> local_50;
  undefined1 local_48 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> dst;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexCounts_local;
  size_t stride_bytes_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *src_local;
  
  dst.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)faceVertexCounts;
  faceVertexCounts_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)src;
  stride_bytes_local = (size_t)this;
  src_local = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  bVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)stride_bytes_local);
  if (bVar2) {
    local_50 = nonstd::expected_lite::make_unexpected<char_const(&)[19]>
                         ((char (*) [19])"src data is empty.");
    nonstd::expected_lite::
    expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>(__return_storage_ptr__,&local_50);
    local_80._44_4_ = 1;
  }
  else if (faceVertexCounts_local == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    local_80._32_8_ =
         nonstd::expected_lite::make_unexpected<char_const(&)[31]>
                   ((char (*) [31])"stride_bytes must be non-zero.");
    nonstd::expected_lite::
    expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::expected<const_char_*,_0>
              (__return_storage_ptr__,(unexpected_type<const_char_*> *)(local_80 + 0x20));
    local_80._44_4_ = 1;
  }
  else {
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)stride_bytes_local);
    if (sVar3 % (ulong)faceVertexCounts_local == 0) {
      sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)stride_bytes_local
                        );
      buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)(sVar3 / (ulong)faceVertexCounts_local);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&faceVertexIndexOffset);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&faceVertexIndexOffset,
                 (size_type)faceVertexCounts_local);
      i = 0;
      cnt = 0;
      while( true ) {
        sVar1 = cnt;
        sVar3 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)stride_bytes);
        if (sVar3 <= sVar1) break;
        pvVar4 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)stride_bytes,cnt)
        ;
        k = (size_t)*pvVar4;
        for (fv_idx = 0; fv_idx < k; fv_idx = fv_idx + 1) {
          uVar5 = fv_idx + i;
          local_138._32_8_ = uVar5;
          sVar3 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                             dst.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
          if (sVar3 <= uVar5) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_178,"faeVertexIndex {} out-of-range at faceVertexCount[{}]",
                       (allocator *)((long)&v_idx + 7));
            fmt::format<unsigned_long,unsigned_long>
                      (&local_158,(fmt *)local_178,(string *)(local_138 + 0x20),&cnt,
                       (unsigned_long *)faceVertexCounts);
            nonstd::expected_lite::make_unexpected<std::__cxx11::string>
                      ((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_138,(expected_lite *)&local_158,value_00);
            nonstd::expected_lite::
            expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::
            expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (__return_storage_ptr__,
                       (unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_conflict1
                        *)local_138);
            nonstd::expected_lite::
            unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~unexpected_type((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_138);
            ::std::__cxx11::string::~string((string *)&local_158);
            ::std::__cxx11::string::~string(local_178);
            ::std::allocator<char>::~allocator((allocator<char> *)((long)&v_idx + 7));
            goto LAB_004a6df6;
          }
          pvVar4 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              dst.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,local_138._32_8_);
          local_1a8._32_8_ = ZEXT48(*pvVar4);
          if (buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage <= (ulong)local_1a8._32_8_) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_1e8,"faeVertexIndices[{}] {} exceeds the number of vertices {}",
                       &local_1e9);
            fmt::format<unsigned_long,unsigned_long,unsigned_long>
                      (&local_1c8,(fmt *)local_1e8,(string *)(local_138 + 0x20),
                       (unsigned_long *)(local_1a8 + 0x20),
                       (unsigned_long *)
                       &buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
                       (unsigned_long *)faceVertexIndices);
            nonstd::expected_lite::make_unexpected<std::__cxx11::string>
                      ((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_1a8,(expected_lite *)&local_1c8,value_01);
            nonstd::expected_lite::
            expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::
            expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (__return_storage_ptr__,
                       (unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_conflict1
                        *)local_1a8);
            nonstd::expected_lite::
            unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~unexpected_type((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)local_1a8);
            ::std::__cxx11::string::~string((string *)&local_1c8);
            ::std::__cxx11::string::~string(local_1e8);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
            goto LAB_004a6df6;
          }
          __dest = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              &faceVertexIndexOffset);
          puVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              stride_bytes_local);
          memcpy(__dest,puVar6 + local_1a8._32_8_ * (long)faceVertexCounts_local,
                 (size_t)faceVertexCounts_local);
          local_200._M_current =
               (uchar *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48
                                  );
          __gnu_cxx::
          __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::__normal_iterator<unsigned_char*>
                    ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                      *)&local_1f8,&local_200);
          __first = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               &faceVertexIndexOffset);
          __last = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              &faceVertexIndexOffset);
          ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
          insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_48,local_1f8,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )__first._M_current,
                     (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                      )__last._M_current);
        }
        i = k + i;
        cnt = cnt + 1;
      }
      nonstd::expected_lite::
      expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_0>
                (__return_storage_ptr__,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
LAB_004a6df6:
      local_80._44_4_ = 1;
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&faceVertexIndexOffset);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_c0,"src size {} must be the multiple of stride_bytes {}",&local_c1);
      num_vertices = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                stride_bytes_local);
      fmt::format<unsigned_long,unsigned_long>
                (&local_a0,(fmt *)local_c0,(string *)&num_vertices,
                 (unsigned_long *)&faceVertexCounts_local,(unsigned_long *)faceVertexCounts);
      nonstd::expected_lite::make_unexpected<std::__cxx11::string>
                ((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_80,(expected_lite *)&local_a0,value);
      nonstd::expected_lite::
      expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (__return_storage_ptr__,
                 (unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_conflict1
                  *)local_80);
      nonstd::expected_lite::
      unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~unexpected_type((unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_80);
      ::std::__cxx11::string::~string((string *)&local_a0);
      ::std::__cxx11::string::~string(local_c0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_c1);
      local_80._44_4_ = 1;
    }
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<std::vector<uint8_t>, std::string> VertexToFaceVarying(
    const std::vector<uint8_t> &src, const size_t stride_bytes,
    const std::vector<uint32_t> &faceVertexCounts,
    const std::vector<uint32_t> &faceVertexIndices) {
  std::vector<uint8_t> dst;

  if (src.empty()) {
    return nonstd::make_unexpected("src data is empty.");
  }

  if (stride_bytes == 0) {
    return nonstd::make_unexpected("stride_bytes must be non-zero.");
  }

  if ((src.size() % stride_bytes) != 0) {
    return nonstd::make_unexpected(
        fmt::format("src size {} must be the multiple of stride_bytes {}",
                    src.size(), stride_bytes));
  }

  const size_t num_vertices = src.size() / stride_bytes;

  std::vector<uint8_t> buf;
  buf.resize(stride_bytes);

  size_t faceVertexIndexOffset{0};

  for (size_t i = 0; i < faceVertexCounts.size(); i++) {
    size_t cnt = faceVertexCounts[i];

    for (size_t k = 0; k < cnt; k++) {
      size_t fv_idx = k + faceVertexIndexOffset;

      if (fv_idx >= faceVertexIndices.size()) {
        return nonstd::make_unexpected(
            fmt::format("faeVertexIndex {} out-of-range at faceVertexCount[{}]",
                        fv_idx, i));
      }

      size_t v_idx = faceVertexIndices[fv_idx];

      if (v_idx >= num_vertices) {
        return nonstd::make_unexpected(fmt::format(
            "faeVertexIndices[{}] {} exceeds the number of vertices {}", fv_idx,
            v_idx, num_vertices));
      }

      memcpy(buf.data(), src.data() + v_idx * stride_bytes, stride_bytes);
      dst.insert(dst.end(), buf.begin(), buf.end());
    }

    faceVertexIndexOffset += cnt;
  }

  return dst;
}